

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

int lys_compile_grouping_pathlog(lysc_ctx *ctx,lysp_node *node,char **path)

{
  uint16_t uVar1;
  int iVar2;
  lysp_node *plVar3;
  char *local_88;
  char *local_70;
  char *local_48;
  char *id;
  char *s;
  lysp_node *plStack_30;
  int len;
  lysp_node *iter;
  char **path_local;
  lysp_node *node_local;
  lysc_ctx *ctx_local;
  
  s._4_4_ = 0;
  *path = (char *)0x0;
  plStack_30 = node;
  iter = (lysp_node *)path;
  path_local = (char **)node;
  node_local = (lysp_node *)ctx;
  do {
    if (plStack_30 == (lysp_node *)0x0 || s._4_4_ < 0) {
      if (s._4_4_ < 0) {
        free(iter->parent);
        iter->parent = (lysp_node *)0x0;
      }
      else if (s._4_4_ == 0) {
        plVar3 = (lysp_node *)strdup("/");
        iter->parent = plVar3;
        s._4_4_ = 1;
      }
      return s._4_4_;
    }
    id = (char *)iter->parent;
    uVar1 = plStack_30->nodetype;
    if (uVar1 == 0x800) {
      iVar2 = asprintf(&local_48,"{uses=\'%s\'}",plStack_30->name);
      if (iVar2 == -1) {
        return -1;
      }
    }
    else if (uVar1 == 0x4000) {
      iVar2 = asprintf(&local_48,"{grouping=\'%s\'}",plStack_30->name);
      if (iVar2 == -1) {
        return -1;
      }
    }
    else if (uVar1 == 0x8000) {
      iVar2 = asprintf(&local_48,"{augment=\'%s\'}",plStack_30->name);
      if (iVar2 == -1) {
        return -1;
      }
    }
    else {
      local_48 = strdup(plStack_30->name);
    }
    if (plStack_30->parent == (lysp_node *)0x0) {
      if (id == (char *)0x0) {
        local_70 = "";
      }
      else {
        local_70 = id;
      }
      s._4_4_ = asprintf((char **)iter,"/%s:%s%s",
                         *(undefined8 *)(*(long *)&node_local->nodetype + 8),local_48,local_70);
    }
    else {
      if (id == (char *)0x0) {
        local_88 = "";
      }
      else {
        local_88 = id;
      }
      s._4_4_ = asprintf((char **)iter,"/%s%s",local_48,local_88);
    }
    free(id);
    free(local_48);
    plStack_30 = plStack_30->parent;
  } while( true );
}

Assistant:

static int
lys_compile_grouping_pathlog(struct lysc_ctx *ctx, struct lysp_node *node, char **path)
{
    struct lysp_node *iter;
    int len = 0;

    *path = NULL;
    for (iter = node; iter && len >= 0; iter = iter->parent) {
        char *s = *path;
        char *id;

        switch (iter->nodetype) {
        case LYS_USES:
            LY_CHECK_RET(asprintf(&id, "{uses='%s'}", iter->name) == -1, -1);
            break;
        case LYS_GROUPING:
            LY_CHECK_RET(asprintf(&id, "{grouping='%s'}", iter->name) == -1, -1);
            break;
        case LYS_AUGMENT:
            LY_CHECK_RET(asprintf(&id, "{augment='%s'}", iter->name) == -1, -1);
            break;
        default:
            id = strdup(iter->name);
            break;
        }

        if (!iter->parent) {
            /* print prefix */
            len = asprintf(path, "/%s:%s%s", ctx->cur_mod->name, id, s ? s : "");
        } else {
            /* prefix is the same as in parent */
            len = asprintf(path, "/%s%s", id, s ? s : "");
        }
        free(s);
        free(id);
    }

    if (len < 0) {
        free(*path);
        *path = NULL;
    } else if (len == 0) {
        *path = strdup("/");
        len = 1;
    }
    return len;
}